

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::leave_seed_mode(torrent *this,seed_mode_t checking)

{
  byte bVar1;
  ulong uVar2;
  _Head_base<0UL,_unsigned_int_*,_false> _Var3;
  char *pcVar4;
  
  if ((this->field_0x5cc & 4) != 0) {
    if (checking == check_files) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** FAILED SEED MODE, rechecking");
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** LEAVING SEED MODE (%s)","as non-seed");
      this->field_0x5cc = this->field_0x5cc & 0xfb;
      uVar2 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
      if ((~uVar2 & 0xe00000000000000) != 0) {
        *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar2 & 0xffffffffbfffffff;
        set_state(this,downloading);
        force_recheck(this);
      }
    }
    else {
      pcVar4 = "as non-seed";
      if (checking == skip_checking) {
        pcVar4 = "as seed";
      }
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** LEAVING SEED MODE (%s)",pcVar4);
      this->field_0x5cc = this->field_0x5cc & 0xfb;
    }
    this->m_num_verified = 0;
    _Var3._M_head_impl =
         *(uint **)&(this->m_verified).super_bitfield.m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    (this->m_verified).super_bitfield.m_buf.
    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
         (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var3._M_head_impl !=
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      operator_delete__(_Var3._M_head_impl);
    }
    _Var3._M_head_impl =
         *(uint **)&(this->m_verifying).super_bitfield.m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    (this->m_verifying).super_bitfield.m_buf.
    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
         (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var3._M_head_impl !=
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      operator_delete__(_Var3._M_head_impl);
    }
    bVar1 = (this->m_need_save_resume_data).m_val;
    if ((bVar1 & 0x40) == 0) {
      (this->m_need_save_resume_data).m_val = bVar1 | 0x40;
      state_updated(this);
      return;
    }
  }
  return;
}

Assistant:

void torrent::leave_seed_mode(seed_mode_t const checking)
	{
		if (!m_seed_mode) return;

		if (checking == seed_mode_t::check_files)
		{
			// this means the user promised we had all the
			// files, but it turned out we didn't. This is
			// an error.

			// TODO: 2 post alert

#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** FAILED SEED MODE, rechecking");
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** LEAVING SEED MODE (%s)"
			, checking == seed_mode_t::skip_checking ? "as seed" : "as non-seed");
#endif
		m_seed_mode = false;
		// seed is false if we turned out not
		// to be a seed after all
		if (checking == seed_mode_t::check_files
			&& state() != torrent_status::checking_resume_data)
		{
			m_have_all = false;
			set_state(torrent_status::downloading);
			force_recheck();
		}
		m_num_verified = 0;
		m_verified.clear();
		m_verifying.clear();

		set_need_save_resume(torrent_handle::if_state_changed);
	}